

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_table.c
# Opt level: O2

uint64_t llmsset_lookup2(llmsset_t dbs,uint64_t a,uint64_t b,int *created,int custom)

{
  ushort uVar1;
  uint64_t *puVar2;
  uint64_t *puVar3;
  uint8_t *puVar4;
  uint uVar5;
  int iVar6;
  ulong *puVar7;
  WorkerP *pWVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  long in_FS_OFFSET;
  bool bVar16;
  uint64_t b_local;
  int local_5c;
  uint64_t a_local;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  b_local = b;
  a_local = a;
  if (custom == 0) {
    local_50 = sylvan_tabhash16(a,b,b);
  }
  else {
    local_50 = (*dbs->hash_cb)(a,b,0xcbf29ce484222325);
  }
  local_5c = 0;
  uVar13 = local_50 & 0xffffff0000000000;
  local_40 = local_50 >> 0x11 & 0xfffffffffffffff0 | 8;
  uVar10 = dbs->mask & local_50;
  uVar12 = 0;
  uVar15 = uVar10;
  local_48 = uVar10;
  local_38 = uVar13;
  do {
    puVar2 = dbs->table;
    uVar9 = puVar2[uVar15];
    uVar11 = uVar12;
    if (uVar9 == 0) {
      if (uVar12 == 0) {
LAB_00122f6d:
        if (*(long *)(in_FS_OFFSET + -0x10) == -1) {
          pWVar8 = lace_get_worker();
          uVar10 = dbs->table_size;
          uVar1 = pWVar8->worker;
          uVar5 = lace_workers();
          *(long *)(in_FS_OFFSET + -0x10) =
               *(long *)(in_FS_OFFSET + -0x10) + ((uVar10 >> 9) * (ulong)uVar1) / (ulong)uVar5;
        }
        else {
          puVar7 = dbs->bitmap2 + *(long *)(in_FS_OFFSET + -0x10) * 8;
          for (lVar14 = 0; (int)lVar14 != -0x200; lVar14 = lVar14 + -0x40) {
            if (*puVar7 != 0xffffffffffffffff) {
              uVar10 = LZCOUNT(~*puVar7);
              LOCK();
              *puVar7 = *puVar7 | 0x8000000000000000U >> (uVar10 & 0x3f);
              UNLOCK();
              uVar12 = *(long *)(in_FS_OFFSET + -0x10) * 0x200;
              if (uVar10 + 1 + uVar12 == lVar14) {
                return 0;
              }
              if (custom != 0) {
                (*dbs->create_cb)(&a_local,&b_local);
              }
              puVar4 = dbs->data;
              uVar12 = (uVar10 | uVar12) - lVar14;
              *(uint64_t *)(puVar4 + uVar12 * 0x10) = a_local;
              *(uint64_t *)(puVar4 + uVar12 * 0x10 + 8) = b_local;
              uVar10 = local_48;
              uVar13 = local_38;
              goto LAB_001230d0;
            }
            puVar7 = puVar7 + 1;
          }
        }
        uVar10 = dbs->table_size >> 9;
        do {
          bVar16 = uVar10 == 0;
          uVar10 = uVar10 - 1;
          if (bVar16) {
            return 0;
          }
          uVar12 = *(long *)(in_FS_OFFSET + -0x10) + 1;
          if (dbs->table_size >> 9 <= uVar12) {
            uVar12 = 0;
          }
          *(ulong *)(in_FS_OFFSET + -0x10) = uVar12;
          uVar13 = 0x8000000000000000 >> (uVar12 & 0x3f);
          puVar3 = dbs->bitmap1;
          while (uVar9 = puVar3[uVar12 >> 6], (uVar9 & uVar13) == 0) {
            puVar7 = puVar3 + (uVar12 >> 6);
            LOCK();
            bVar16 = uVar9 == *puVar7;
            if (bVar16) {
              *puVar7 = uVar9 | uVar13;
            }
            UNLOCK();
            if (bVar16) goto LAB_00122f6d;
          }
        } while( true );
      }
LAB_001230d0:
      puVar7 = puVar2 + uVar15;
      LOCK();
      uVar9 = *puVar7;
      bVar16 = uVar9 == 0;
      if (bVar16) {
        *puVar7 = uVar12 | uVar13;
        uVar9 = 0;
      }
      UNLOCK();
      uVar11 = uVar12;
      if (bVar16) {
        iVar6 = 1;
        if (custom != 0) {
          dbs->bitmapc[uVar12 >> 6] =
               dbs->bitmapc[uVar12 >> 6] | 0x8000000000000000U >> (uVar12 & 0x3f);
        }
        goto LAB_00123242;
      }
    }
    if (uVar13 == (uVar9 & 0xffffff0000000000)) {
      uVar12 = uVar9 & 0xffffffffff;
      puVar4 = dbs->data;
      lVar14 = uVar12 * 0x10;
      if (custom == 0) {
        if ((*(uint64_t *)(puVar4 + lVar14) == a_local) &&
           (*(uint64_t *)(puVar4 + lVar14 + 8) == b_local)) {
          if (uVar11 != 0) {
            LOCK();
            dbs->bitmap2[uVar11 >> 6] =
                 dbs->bitmap2[uVar11 >> 6] & ~(0x8000000000000000U >> (uVar11 & 0x3f));
            UNLOCK();
          }
          goto LAB_00123239;
        }
      }
      else {
        iVar6 = (*dbs->equals_cb)(a_local,b_local,*(uint64_t *)(puVar4 + lVar14),
                                  *(uint64_t *)(puVar4 + lVar14 + 8));
        uVar10 = local_48;
        if (iVar6 != 0) {
          if (uVar11 != 0) {
            (*dbs->destroy_cb)(a_local,b_local);
            LOCK();
            dbs->bitmap2[uVar11 >> 6] =
                 dbs->bitmap2[uVar11 >> 6] & ~(0x8000000000000000U >> (uVar11 & 0x3f));
            UNLOCK();
          }
LAB_00123239:
          iVar6 = 0;
LAB_00123242:
          *created = iVar6;
          return uVar12;
        }
      }
    }
    uVar15 = (ulong)((int)uVar15 + 1U & 7) | uVar15 & 0xfffffffffffffff8;
    uVar12 = uVar11;
    if (uVar15 == uVar10) {
      local_5c = local_5c + 1;
      if (local_5c == dbs->threshold) {
        return 0;
      }
      local_50 = local_50 + local_40;
      uVar10 = dbs->mask & local_50;
      uVar15 = uVar10;
      local_48 = uVar10;
    }
  } while( true );
}

Assistant:

static inline uint64_t
llmsset_lookup2(const llmsset_t dbs, uint64_t a, uint64_t b, int* created, const int custom)
{
    uint64_t hash_rehash = 14695981039346656037LLU;
    if (custom) hash_rehash = dbs->hash_cb(a, b, hash_rehash);
    else hash_rehash = sylvan_tabhash16(a, b, hash_rehash);

    const uint64_t step = (((hash_rehash >> 20) | 1) << 3);
    const uint64_t hash = hash_rehash & MASK_HASH;
    uint64_t idx, last, cidx = 0;
    int i=0;

#if LLMSSET_MASK
    last = idx = hash_rehash & dbs->mask;
#else
    last = idx = hash_rehash % dbs->table_size;
#endif

    for (;;) {
        _Atomic(uint64_t)* bucket = dbs->table + idx;
        uint64_t v = atomic_load_explicit(bucket, memory_order_acquire);

        if (v == 0) {
            if (cidx == 0) {
                // Claim data bucket and write data
                cidx = claim_data_bucket(dbs);
                if (cidx == (uint64_t)-1) return 0; // failed to claim a data bucket
                if (custom) dbs->create_cb(&a, &b);
                uint64_t *d_ptr = ((uint64_t*)dbs->data) + 2*cidx;
                d_ptr[0] = a;
                d_ptr[1] = b;
            }
            if (atomic_compare_exchange_strong(bucket, &v, hash | cidx)) {
                if (custom) set_custom_bucket(dbs, cidx, custom);
                *created = 1;
                return cidx;
            }
        }

        if (hash == (v & MASK_HASH)) {
            uint64_t d_idx = v & MASK_INDEX;
            uint64_t *d_ptr = ((uint64_t*)dbs->data) + 2*d_idx;
            if (custom) {
                if (dbs->equals_cb(a, b, d_ptr[0], d_ptr[1])) {
                    if (cidx != 0) {
                        dbs->destroy_cb(a, b);
                        release_data_bucket(dbs, cidx);
                    }
                    *created = 0;
                    return d_idx;
                }
            } else {
                if (d_ptr[0] == a && d_ptr[1] == b) {
                    if (cidx != 0) release_data_bucket(dbs, cidx);
                    *created = 0;
                    return d_idx;
                }
            }
        }

        sylvan_stats_count(LLMSSET_LOOKUP);

        // find next idx on probe sequence
        idx = (idx & CL_MASK) | ((idx+1) & CL_MASK_R);
        if (idx == last) {
            if (++i == dbs->threshold) return 0; // failed to find empty spot in probe sequence

            // go to next cache line in probe sequence
            hash_rehash += step;

#if LLMSSET_MASK
            last = idx = hash_rehash & dbs->mask;
#else
            last = idx = hash_rehash % dbs->table_size;
#endif
        }
    }
}